

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::GlobOperator,bool,false,true>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  ulong uVar2;
  bool *pbVar3;
  bool bVar4;
  ulong uVar5;
  char *pcVar6;
  unsigned_long *puVar7;
  idx_t iVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  char *string;
  ulong uVar12;
  char **ppcVar13;
  ulong uVar14;
  char **local_98;
  undefined8 local_88;
  char *local_80;
  undefined8 local_78;
  char *local_70;
  ulong local_68;
  bool *local_60;
  bool *local_58;
  ulong local_50;
  unsigned_long *local_48;
  string_t *local_40;
  ulong local_38;
  
  puVar7 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_60 = result_data;
  if (puVar7 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar5 = *(ulong *)&rdata->value;
      pcVar10 = (rdata->value).pointer.ptr;
      pcVar6 = (char *)((long)&local_78 + 4);
      if (0xc < (uint)uVar5) {
        pcVar6 = pcVar10;
      }
      local_98 = &(ldata->value).pointer.ptr;
      iVar8 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_98 + -1);
        local_88._0_4_ = paVar1->length;
        local_88._4_1_ = paVar1->prefix[0];
        local_88._5_1_ = paVar1->prefix[1];
        local_88._6_1_ = paVar1->prefix[2];
        local_88._7_1_ = paVar1->prefix[3];
        local_80 = *local_98;
        string = local_80;
        if ((uint)(undefined4)local_88 < 0xd) {
          string = (char *)((long)&local_88 + 4);
        }
        local_78 = uVar5;
        local_70 = pcVar10;
        bVar4 = Glob(string,local_88 & 0xffffffff,pcVar6,uVar5 & 0xffffffff,true);
        local_60[iVar8] = bVar4;
        iVar8 = iVar8 + 1;
        local_98 = local_98 + 2;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = count + 0x3f >> 6;
    local_68 = 0;
    uVar14 = 0;
    local_50 = uVar5;
    local_48 = puVar7;
    local_40 = rdata;
    local_38 = count;
    do {
      pbVar3 = local_60;
      uVar2 = puVar7[local_68];
      uVar9 = uVar14 + 0x40;
      if (local_38 <= uVar14 + 0x40) {
        uVar9 = local_38;
      }
      uVar11 = uVar9;
      if (uVar2 != 0) {
        uVar11 = uVar14;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar14 < uVar9) {
            uVar2 = *(ulong *)&rdata->value;
            local_58 = (bool *)(rdata->value).pointer.ptr;
            pcVar10 = local_58;
            if ((uint)uVar2 < 0xd) {
              pcVar10 = (char *)((long)&local_78 + 4);
            }
            ppcVar13 = &ldata[uVar14].value.pointer.ptr;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar13 + -1);
              local_88._0_4_ = paVar1->length;
              local_88._4_1_ = paVar1->prefix[0];
              local_88._5_1_ = paVar1->prefix[1];
              local_88._6_1_ = paVar1->prefix[2];
              local_88._7_1_ = paVar1->prefix[3];
              local_80 = *ppcVar13;
              local_70 = local_58;
              pcVar6 = local_80;
              if ((uint)(undefined4)local_88 < 0xd) {
                pcVar6 = (char *)((long)&local_88 + 4);
              }
              local_78 = uVar2;
              bVar4 = Glob(pcVar6,local_88 & 0xffffffff,pcVar10,uVar2 & 0xffffffff,true);
              pbVar3[uVar14] = bVar4;
              uVar14 = uVar14 + 1;
              ppcVar13 = ppcVar13 + 2;
              uVar5 = local_50;
              puVar7 = local_48;
              uVar11 = uVar9;
              rdata = local_40;
            } while (uVar9 != uVar14);
          }
        }
        else if (uVar14 < uVar9) {
          local_58 = local_60 + uVar14;
          ppcVar13 = &ldata[uVar14].value.pointer.ptr;
          uVar12 = 0;
          do {
            if ((uVar2 >> (uVar12 & 0x3f) & 1) != 0) {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar13 + -1);
              local_88._0_4_ = paVar1->length;
              local_88._4_1_ = paVar1->prefix[0];
              local_88._5_1_ = paVar1->prefix[1];
              local_88._6_1_ = paVar1->prefix[2];
              local_88._7_1_ = paVar1->prefix[3];
              local_80 = *ppcVar13;
              local_78 = *(ulong *)&rdata->value;
              local_70 = (rdata->value).pointer.ptr;
              pcVar10 = local_80;
              if ((uint)(undefined4)local_88 < 0xd) {
                pcVar10 = (char *)((long)&local_88 + 4);
              }
              pcVar6 = local_70;
              if ((uint)local_78 < 0xd) {
                pcVar6 = (char *)((long)&local_78 + 4);
              }
              bVar4 = Glob(pcVar10,local_88 & 0xffffffff,pcVar6,local_78 & 0xffffffff,true);
              local_58[uVar12] = bVar4;
            }
            uVar12 = uVar12 + 1;
            ppcVar13 = ppcVar13 + 2;
            uVar5 = local_50;
            uVar11 = uVar9;
          } while (uVar9 - uVar14 != uVar12);
        }
      }
      local_68 = local_68 + 1;
      uVar14 = uVar11;
    } while (local_68 != uVar5);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}